

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O1

bool tcu::floatUlpThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  int height;
  uint depth;
  TextureFormat TVar1;
  int i;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  TextureChannelClass TVar5;
  long lVar6;
  TestError *this;
  ulong uVar7;
  ConstPixelBufferAccess *pCVar8;
  ulong uVar9;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  int width;
  _Alloc_hider _Var10;
  int y;
  uint uVar11;
  ulong uVar12;
  int z;
  bool bVar13;
  Vec4 pixelScale;
  Vector<bool,_4> res;
  Vec4 cmpPix;
  UVec4 diff;
  Vec4 refPix;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  allocator<char> local_4c2;
  allocator<char> local_4c1;
  TextureFormat local_4c0;
  ConstPixelBufferAccess *local_4b8;
  int local_4ac;
  Vec4 local_4a8;
  Vec4 local_498;
  string local_488;
  string local_468;
  LogImageSet local_448;
  char *local_408;
  char *local_400;
  Vector<unsigned_int,_4> local_3f8;
  string local_3e8;
  ulong local_3c8;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  float local_318;
  float local_314;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  _Alloc_hider local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f0 [6];
  LogImage local_290;
  undefined1 local_200 [8];
  float local_1f8;
  float local_1f4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_188 [264];
  ConstPixelBufferAccess local_80;
  TextureLevel local_58;
  
  width = (reference->m_size).m_data[0];
  height = (reference->m_size).m_data[1];
  depth = (reference->m_size).m_data[2];
  local_200._0_4_ = RGB;
  local_200._4_4_ = UNORM_INT8;
  local_4c0 = (TextureFormat)log;
  local_4b8 = reference;
  local_408 = imageSetDesc;
  local_400 = imageSetName;
  TextureLevel::TextureLevel(&local_58,(TextureFormat *)local_200,width,height,depth);
  TextureLevel::getAccess((PixelBufferAccess *)&local_80,&local_58);
  local_3f8.m_data._0_8_ = (pointer)0x0;
  local_3f8.m_data[2] = 0;
  local_3f8.m_data[3] = 0;
  local_4a8.m_data[0] = 0.0;
  local_4a8.m_data[1] = 0.0;
  local_4a8.m_data[2] = 0.0;
  local_4a8.m_data[3] = 0.0;
  local_498.m_data[0] = 1.0;
  local_498.m_data[1] = 1.0;
  local_498.m_data[2] = 1.0;
  local_498.m_data[3] = 1.0;
  if ((((result->m_size).m_data[0] != width) || ((result->m_size).m_data[1] != height)) ||
     ((result->m_size).m_data[2] != depth)) {
    this = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (this,(char *)0x0,
               "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,499);
    __cxa_throw(this,&TestError::typeinfo,Exception::~Exception);
  }
  if (0 < (int)depth) {
    uVar12 = 0;
    local_4ac = width;
    do {
      if (0 < height) {
        z = 0;
        local_3c8 = uVar12;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_200,(int)local_4b8,y,z);
              ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_320,(int)result,y,z);
              dVar2 = computeFloatFlushRelaxedULPDiff((float)local_200._0_4_,(float)local_320._0_4_)
              ;
              dVar3 = computeFloatFlushRelaxedULPDiff((float)local_200._4_4_,(float)local_320._4_4_)
              ;
              dVar4 = computeFloatFlushRelaxedULPDiff(local_1f8,local_318);
              local_290.m_name._M_string_length._4_4_ =
                   computeFloatFlushRelaxedULPDiff(local_1f4,local_314);
              uVar12 = local_3c8;
              width = local_4ac;
              local_290.m_name._M_dataplus._M_p._0_4_ = dVar2;
              local_290.m_name._M_dataplus._M_p._4_4_ = dVar3;
              local_290.m_name._M_string_length._0_4_ = dVar4;
              local_448.m_name._M_dataplus._M_p = (pointer)0x0;
              lVar6 = 0;
              do {
                *(bool *)((long)&local_448.m_name._M_dataplus._M_p + lVar6) =
                     *(uint *)((long)(&local_290.m_access.m_size + -6) + lVar6 * 4) <=
                     threshold->m_data[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              if ((char)local_448.m_name._M_dataplus._M_p == '\0') {
                bVar13 = false;
              }
              else {
                uVar9 = 0;
                do {
                  uVar7 = uVar9;
                  if (uVar7 == 3) break;
                  uVar9 = uVar7 + 1;
                } while (*(char *)((long)&local_448.m_name._M_dataplus._M_p + uVar7 + 1) != '\0');
                bVar13 = 2 < uVar7;
              }
              local_448.m_name._M_dataplus._M_p = (pointer)0x0;
              local_448.m_name._M_string_length = 0;
              lVar6 = 0;
              do {
                uVar11 = *(uint *)((long)(&local_290.m_access.m_size + -6) + lVar6 * 4);
                if (uVar11 < local_3f8.m_data[lVar6]) {
                  uVar11 = local_3f8.m_data[lVar6];
                }
                *(uint *)((long)&local_448.m_name._M_dataplus._M_p + lVar6 * 4) = uVar11;
                lVar6 = lVar6 + 1;
              } while (lVar6 != 4);
              local_3f8.m_data._0_8_ = local_448.m_name._M_dataplus._M_p;
              local_3f8.m_data[2] = (undefined4)local_448.m_name._M_string_length;
              local_3f8.m_data[3] = local_448.m_name._M_string_length._4_4_;
              if (bVar13) {
                local_448.m_name._M_dataplus._M_p = (char *)0x3f80000000000000;
              }
              else {
                local_448.m_name._M_dataplus._M_p = (char *)0x3f800000;
              }
              local_448.m_name._M_string_length = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_80,(Vec4 *)&local_448,y,z,(int)local_3c8);
              y = y + 1;
            } while (y != width);
          }
          z = z + 1;
        } while (z != height);
      }
      uVar11 = (int)uVar12 + 1;
      uVar12 = (ulong)uVar11;
    } while (uVar11 != depth);
  }
  local_200 = (undefined1  [8])((ulong)local_200 & 0xffffffff00000000);
  lVar6 = 0;
  do {
    local_200[lVar6] = local_3f8.m_data[lVar6] <= threshold->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  if (local_200[0] == R) {
    bVar13 = false;
  }
  else {
    uVar12 = 0;
    do {
      uVar9 = uVar12;
      if (uVar9 == 3) break;
      uVar12 = uVar9 + 1;
    } while (local_200[uVar9 + 1] != '\0');
    bVar13 = 2 < uVar9;
  }
  if ((logMode != COMPARE_LOG_EVERYTHING & bVar13) == 0) {
    TVar5 = getTextureChannelClass((local_4b8->m_format).type);
    if ((TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) ||
       (TVar5 = getTextureChannelClass((result->m_format).type),
       TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)) {
      anon_unknown_50::computeScaleAndBias(local_4b8,result,&local_498,&local_4a8);
      local_200._0_4_ = local_4c0.order;
      local_200._4_4_ = local_4c0.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,
                 "Result and reference images are normalized with formula p * ",0x3c);
      operator<<((ostream *)&local_1f8,&local_498);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," + ",3);
      operator<<((ostream *)&local_1f8,&local_4a8);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    if (bVar13 == false) {
      local_200._0_4_ = local_4c0.order;
      local_200._4_4_ = local_4c0.type;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1f8,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)&local_1f8,&local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,", threshold = ",0xe)
      ;
      operator<<((ostream *)&local_1f8,threshold);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_200,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
      std::ios_base::~ios_base(local_188);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_468,local_400,&local_4c1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,local_408,&local_4c2);
    TVar1 = local_4c0;
    LogImageSet::LogImageSet(&local_448,&local_468,&local_488);
    TestLog::startImageSet
              ((TestLog *)TVar1,local_448.m_name._M_dataplus._M_p,
               local_448.m_description._M_dataplus._M_p);
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_3e8,&local_3c0,result,&local_498,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,TVar1.order,__buf_00,(size_t)result);
    local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_340,"Reference","");
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"Reference","");
    pCVar8 = local_4b8;
    LogImage::LogImage((LogImage *)local_320,&local_340,&local_360,local_4b8,&local_498,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_320,local_4c0.order,__buf_01,(size_t)pCVar8);
    local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"ErrorMask","");
    local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0,"Error mask","");
    pCVar8 = &local_80;
    LogImage::LogImage(&local_290,&local_380,&local_3a0,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    TVar1 = local_4c0;
    LogImage::write(&local_290,local_4c0.order,__buf_02,(size_t)pCVar8);
    TestLog::endImageSet((TestLog *)TVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290.m_description._M_dataplus._M_p != &local_290.m_description.field_2) {
      operator_delete(local_290.m_description._M_dataplus._M_p,
                      local_290.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_290.m_name._M_dataplus._M_p._4_4_,
                    (deUint32)local_290.m_name._M_dataplus._M_p) != &local_290.m_name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_290.m_name._M_dataplus._M_p._4_4_,
                               (deUint32)local_290.m_name._M_dataplus._M_p),
                      local_290.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_380._M_dataplus._M_p != &local_380.field_2) {
      operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != local_2f0) {
      operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_320._4_4_,local_320._0_4_) != &local_310) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_320._4_4_,local_320._0_4_),
                      local_310._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
      operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448.m_description._M_dataplus._M_p != &local_448.m_description.field_2) {
      operator_delete(local_448.m_description._M_dataplus._M_p,
                      local_448.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448.m_name._M_dataplus._M_p != &local_448.m_name.field_2) {
      operator_delete(local_448.m_name._M_dataplus._M_p,
                      local_448.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    _Var10._M_p = local_468._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p == &local_468.field_2) goto LAB_001daefd;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_001daefd;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_498,&local_4a8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,local_400,(allocator<char> *)&local_3e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_448,local_408,(allocator<char> *)&local_3c0);
    TVar1 = local_4c0;
    LogImageSet::LogImageSet((LogImageSet *)local_320,&local_290.m_name,&local_448.m_name);
    TestLog::startImageSet
              ((TestLog *)TVar1,(char *)CONCAT44(local_320._4_4_,local_320._0_4_),local_300._M_p);
    local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_468,"Result","");
    local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_488,"Result","");
    LogImage::LogImage((LogImage *)local_200,&local_468,&local_488,result,&local_498,&local_4a8,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_200,TVar1.order,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)TVar1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_p != local_1d0) {
      operator_delete(local_1e0._M_p,local_1d0[0]._M_allocated_capacity + 1);
    }
    if (local_200 != (undefined1  [8])&local_1f0) {
      operator_delete((void *)local_200,local_1f0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_dataplus._M_p != &local_488.field_2) {
      operator_delete(local_488._M_dataplus._M_p,local_488.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_468._M_dataplus._M_p != &local_468.field_2) {
      operator_delete(local_468._M_dataplus._M_p,local_468.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_p != local_2f0) {
      operator_delete(local_300._M_p,local_2f0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_320._4_4_,local_320._0_4_) != &local_310) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_320._4_4_,local_320._0_4_),
                      local_310._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448.m_name._M_dataplus._M_p != &local_448.m_name.field_2) {
      operator_delete(local_448.m_name._M_dataplus._M_p,
                      local_448.m_name.field_2._M_allocated_capacity + 1);
    }
    _Var10._M_p = (pointer)CONCAT44(local_290.m_name._M_dataplus._M_p._4_4_,
                                    (deUint32)local_290.m_name._M_dataplus._M_p);
    local_468.field_2._M_allocated_capacity = local_290.m_name.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var10._M_p == &local_290.m_name.field_2) goto LAB_001daefd;
  }
  operator_delete(_Var10._M_p,local_468.field_2._M_allocated_capacity + 1);
LAB_001daefd:
  TextureLevel::~TextureLevel(&local_58);
  return bVar13;
}

Assistant:

bool floatUlpThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	refPix	= reference.getPixel(x, y, z);
				const Vec4	cmpPix	= result.getPixel(x, y, z);
				const UVec4	diff	= computeFlushRelaxedULPDiff(refPix, cmpPix);
				const bool	isOk	= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}